

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Entity.h
# Opt level: O1

void __thiscall
entityx::EntityManager::
ViewIterator<entityx::EntityManager::UnpackingView<Position,_Direction,_Tag>::Iterator,_false>::next
          (ViewIterator<entityx::EntityManager::UnpackingView<Position,_Direction,_Tag>::Iterator,_false>
           *this)

{
  ulong uVar1;
  ulong uVar2;
  long lVar3;
  ulong uVar4;
  EntityManager *this_00;
  EntityManager *pEVar5;
  ulong uVar6;
  uint uVar7;
  Id id;
  ComponentHandle<Position,_entityx::EntityManager> CVar8;
  ComponentHandle<Direction,_entityx::EntityManager> CVar9;
  ComponentHandle<Tag,_entityx::EntityManager> CVar10;
  
  uVar1 = this->capacity_;
  uVar7 = this->i_;
  uVar6 = (ulong)uVar7;
  if (uVar6 < uVar1) {
    uVar2 = (this->mask_).super__Base_bitset<1UL>._M_w;
    lVar3 = *(long *)(this->manager_ + 0x48);
    uVar4 = *(ulong *)(lVar3 + uVar6 * 8);
    while ((uVar2 & ~uVar4) != 0) {
      uVar7 = uVar7 + 1;
      this->i_ = uVar7;
      uVar6 = (ulong)uVar7;
      if (uVar1 <= uVar6) {
        return;
      }
      uVar4 = *(ulong *)(lVar3 + uVar6 * 8);
    }
    if (uVar6 < uVar1) {
      this_00 = this->manager_;
      pEVar5 = this[1].manager_;
      id.id_ = (ulong)*(uint *)(*(long *)(this_00 + 0x60) + uVar6 * 4) << 0x20 | uVar6;
      CVar8 = component<Position,void>(this_00,id);
      **(ComponentHandle<Position,_entityx::EntityManager> **)(pEVar5 + 0x10) = CVar8;
      CVar9 = component<Direction,void>(this_00,id);
      **(ComponentHandle<Direction,_entityx::EntityManager> **)(pEVar5 + 8) = CVar9;
      CVar10 = component<Tag,void>(this_00,id);
      **(ComponentHandle<Tag,_entityx::EntityManager> **)pEVar5 = CVar10;
    }
  }
  return;
}

Assistant:

void next() {
      while (i_ < capacity_ && !predicate()) {
        ++i_;
      }

      if (i_ < capacity_) {
        Entity entity = manager_->get(manager_->create_id(i_));
        static_cast<Delegate*>(this)->next_entity(entity);
      }
    }